

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Cluster::GetNext(Cluster *this,BlockEntry *pCurr,BlockEntry **pNext)

{
  long lVar1;
  long lVar2;
  undefined8 *in_RDX;
  BlockEntry *in_RSI;
  long in_RDI;
  long status;
  long len;
  longlong pos;
  size_t idx;
  long *in_stack_00000048;
  longlong *in_stack_00000050;
  Cluster *in_stack_00000058;
  
  lVar1 = BlockEntry::GetIndex(in_RSI);
  if (*(ulong *)(in_RDI + 0x40) <= lVar1 + 1U) {
    lVar2 = Parse(in_stack_00000058,in_stack_00000050,in_stack_00000048);
    if (lVar2 < 0) {
      *in_RDX = 0;
      return lVar2;
    }
    if (0 < lVar2) {
      *in_RDX = 0;
      return 0;
    }
  }
  *in_RDX = *(undefined8 *)(*(long *)(in_RDI + 0x30) + (lVar1 + 1U) * 8);
  return 0;
}

Assistant:

long Cluster::GetNext(const BlockEntry* pCurr, const BlockEntry*& pNext) const {
  assert(pCurr);
  assert(m_entries);
  assert(m_entries_count > 0);

  size_t idx = pCurr->GetIndex();
  assert(idx < size_t(m_entries_count));
  assert(m_entries[idx] == pCurr);

  ++idx;

  if (idx >= size_t(m_entries_count)) {
    long long pos;
    long len;

    const long status = Parse(pos, len);

    if (status < 0) {  // error
      pNext = NULL;
      return status;
    }

    if (status > 0) {
      pNext = NULL;
      return 0;
    }

    assert(m_entries);
    assert(m_entries_count > 0);
    assert(idx < size_t(m_entries_count));
  }

  pNext = m_entries[idx];
  assert(pNext);

  return 0;
}